

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOArrayLengthCase::iterate(SSBOArrayLengthCase *this)

{
  ostringstream *poVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  uint *value;
  MessageBuilder *this_00;
  TestError *pTVar7;
  char *description;
  allocator<char> local_1b1;
  undefined1 local_1b0 [384];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Allocating float memory buffer with ");
  std::ostream::operator<<(poVar1,0x10);
  std::operator<<((ostream *)poVar1," elements.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar6 + 0x40))(0x90d2,this->m_targetBufferID);
  (**(code **)(lVar6 + 0x150))(0x90d2,0x40,0,0x88ea);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"update buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xc0);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Running compute shader.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar6 + 0x1680))((this->m_shader->m_program).m_program);
  (**(code **)(lVar6 + 0x528))(1,1,1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xc9);
  (**(code **)(lVar6 + 0x40))(0x90d2,this->m_outputBufferID);
  value = (uint *)(**(code **)(lVar6 + 0xd00))(0x90d2,0,4,1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"map",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xd1);
  if (value == (uint *)0x0) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"mapBufferRange returned NULL",&local_1b1);
    tcu::TestError::TestError(pTVar7,(string *)local_1b0);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar2 = *value;
  if (uVar2 == 0x10) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Length returned was correct.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"ERROR: Length returned was ");
    this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
    std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", expected ");
    std::ostream::operator<<(&this_00->m_str,0x10);
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  cVar3 = (**(code **)(lVar6 + 0x1670))(0x90d2);
  if (cVar3 != '\0') {
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"unmap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                    ,0xe1);
    if (uVar2 != 0x10) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(uVar2 != 0x10),
               description);
    return STOP;
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"unmapBuffer returned false",&local_1b1);
  tcu::TestError::TestError(pTVar7,(string *)local_1b0);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

SSBOArrayLengthCase::IterateResult SSBOArrayLengthCase::iterate (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	bool					error	= false;

	// Update buffer size

	m_testCtx.getLog() << tcu::TestLog::Message << "Allocating float memory buffer with " << static_cast<int>(s_fixedBufferSize) << " elements." << tcu::TestLog::EndMessage;

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_targetBufferID);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, s_fixedBufferSize * (int)sizeof(float), DE_NULL, GL_DYNAMIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "update buffer");

	// Run compute

	m_testCtx.getLog() << tcu::TestLog::Message << "Running compute shader." << tcu::TestLog::EndMessage;

	gl.useProgram(m_shader->getProgram());
	gl.dispatchCompute(1, 1, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "dispatch");

	// Verify
	{
		const void* ptr;

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBufferID);
		ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (int)sizeof(deUint32), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "map");

		if (!ptr)
			throw tcu::TestError("mapBufferRange returned NULL");

		if (*(const deUint32*)ptr != (deUint32)s_fixedBufferSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Length returned was " << *(const deUint32*)ptr << ", expected " << static_cast<int>(s_fixedBufferSize) << tcu::TestLog::EndMessage;
			error = true;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Length returned was correct." << tcu::TestLog::EndMessage;

		if (gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER) == GL_FALSE)
			throw tcu::TestError("unmapBuffer returned false");

		GLU_EXPECT_NO_ERROR(gl.getError(), "unmap");
	}

	if (!error)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	return STOP;
}